

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall
jsonnet::internal::anon_unknown_0::Parser::parseComprehensionSpecs
          (Token *__return_storage_ptr__,Parser *this,Kind end,Fodder *for_fodder,
          vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
          *specs)

{
  Kind KVar1;
  Allocator *this_00;
  vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
  *this_01;
  Identifier *pIVar2;
  ostream *poVar3;
  StaticError *this_02;
  Kind local_3cc;
  Fodder *local_3c8;
  vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
  *local_3c0;
  void *local_3b8;
  AST *cond;
  AST *arr;
  Identifier *id;
  string local_398;
  LocationRange l;
  Token in_token;
  Token id_token;
  stringstream ss;
  pointer local_1a8 [47];
  
  local_3c8 = for_fodder;
  local_3c0 = (vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
               *)specs;
  while( true ) {
    l.file._M_dataplus._M_p = (pointer)&l.file.field_2;
    l.file._M_string_length = 0;
    l.file.field_2._M_local_buf[0] = '\0';
    l.end.line = 0;
    l.end.column = 0;
    l.begin.line = 0;
    l.begin.column = 0;
    popExpect(&id_token,this,IDENTIFIER,(char *)0x0);
    this_00 = this->alloc;
    Token::data32_abi_cxx11_((UString *)&ss,&id_token);
    pIVar2 = Allocator::makeIdentifier(this_00,(UString *)&ss);
    this_01 = local_3c0;
    std::__cxx11::u32string::~u32string((u32string *)&ss);
    id = pIVar2;
    popExpect(&in_token,this,IN,(char *)0x0);
    arr = parse(this,0xf);
    _ss = _ss & 0xffffffff00000000;
    std::
    vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
    ::
    emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::Identifier_const*&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,jsonnet::internal::AST*&>
              (this_01,(Kind *)&ss,local_3c8,&id_token.fodder,&id,&in_token.fodder,&arr);
    pop(__return_storage_ptr__,this);
    while (KVar1 = __return_storage_ptr__->kind, KVar1 == IF) {
      cond = parse(this,0xf);
      local_3cc = IF;
      local_1a8[0] = (pointer)0x0;
      _ss = 0;
      local_3b8 = (void *)0x0;
      local_398._M_dataplus._M_p = (pointer)0x0;
      local_398._M_string_length = 0;
      local_398.field_2._M_allocated_capacity = 0;
      std::
      vector<jsonnet::internal::ComprehensionSpec,std::allocator<jsonnet::internal::ComprehensionSpec>>
      ::
      emplace_back<jsonnet::internal::ComprehensionSpec::Kind,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,decltype(nullptr),std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>,jsonnet::internal::AST*&>
                (this_01,&local_3cc,&__return_storage_ptr__->fodder,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&ss,&local_3b8,
                 (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                  *)&local_398,&cond);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&local_398);
      std::
      vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
      ~vector((vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
               *)&ss);
      pop((Token *)&ss,this);
      Token::operator=(__return_storage_ptr__,(Token *)&ss);
      Token::~Token((Token *)&ss);
    }
    if (KVar1 == end) break;
    if (KVar1 != FOR) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<((ostream *)local_1a8,"expected for, if or ");
      internal::operator<<(poVar3,end);
      poVar3 = std::operator<<(poVar3," after for clause, got: ");
      internal::operator<<(poVar3,__return_storage_ptr__);
      this_02 = (StaticError *)__cxa_allocate_exception(0x60);
      std::__cxx11::stringbuf::str();
      StaticError::StaticError(this_02,&__return_storage_ptr__->location,&local_398);
      __cxa_throw(this_02,&StaticError::typeinfo,StaticError::~StaticError);
    }
    std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
    ::operator=(local_3c8,&__return_storage_ptr__->fodder);
    Token::~Token(__return_storage_ptr__);
    Token::~Token(&in_token);
    Token::~Token(&id_token);
    std::__cxx11::string::~string((string *)&l);
  }
  Token::~Token(&in_token);
  Token::~Token(&id_token);
  std::__cxx11::string::~string((string *)&l);
  return __return_storage_ptr__;
}

Assistant:

Token parseComprehensionSpecs(Token::Kind end, Fodder for_fodder,
                                  std::vector<ComprehensionSpec> &specs)
    {
        while (true) {
            LocationRange l;
            Token id_token = popExpect(Token::IDENTIFIER);
            const Identifier *id = alloc->makeIdentifier(id_token.data32());
            Token in_token = popExpect(Token::IN);
            AST *arr = parse(MAX_PRECEDENCE);
            specs.emplace_back(
                ComprehensionSpec::FOR, for_fodder, id_token.fodder, id, in_token.fodder, arr);

            Token maybe_if = pop();
            for (; maybe_if.kind == Token::IF; maybe_if = pop()) {
                AST *cond = parse(MAX_PRECEDENCE);
                specs.emplace_back(
                    ComprehensionSpec::IF, maybe_if.fodder, Fodder{}, nullptr, Fodder{}, cond);
            }
            if (maybe_if.kind == end) {
                return maybe_if;
            }
            if (maybe_if.kind != Token::FOR) {
                std::stringstream ss;
                ss << "expected for, if or " << end << " after for clause, got: " << maybe_if;
                throw StaticError(maybe_if.location, ss.str());
            }
            for_fodder = maybe_if.fodder;
        }
    }